

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

int mtbdd_set_contains(MTBDD set,uint32_t var)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int in_R10D;
  uint uVar4;
  
  do {
    if (set == 0x8000000000000000) {
      return 0;
    }
    lVar3 = (set & 0xffffffffff) * 0x10;
    uVar4 = (uint)((ulong)*(undefined8 *)(nodes->data + lVar3 + 8) >> 0x28);
    if (uVar4 == var) {
      iVar2 = 1;
LAB_00128b20:
      in_R10D = iVar2;
      bVar1 = false;
    }
    else {
      iVar2 = 0;
      if (var < uVar4) goto LAB_00128b20;
      set = set & 0x8000000000000000 ^ *(ulong *)(nodes->data + lVar3) & 0x800000ffffffffff;
      bVar1 = true;
    }
    if (!bVar1) {
      return in_R10D;
    }
  } while( true );
}

Assistant:

int
mtbdd_set_contains(MTBDD set, uint32_t var)
{
    while (set != mtbdd_true) {
        mtbddnode_t n = MTBDD_GETNODE(set);
        uint32_t v = mtbddnode_getvariable(n);
        if (v == var) return 1;
        if (v > var) return 0;
        set = node_gethigh(set, n);
    }
    return 0;
}